

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O1

bool spvParseTargetEnv(char *s,spv_target_env *env)

{
  char *__s;
  int iVar1;
  size_t __n;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  bVar4 = true;
  lVar2 = 8;
  do {
    if (s == (char *)0x0) {
      bVar3 = false;
    }
    else {
      __s = *(char **)((long)pygen_variable_CLDEBUG100_DebugOperationEntries[9].operandTypes +
                      lVar2 + 0x40);
      __n = strlen(__s);
      iVar1 = strncmp(s,__s,__n);
      bVar3 = iVar1 == 0;
    }
    if (bVar3) {
      if (env != (spv_target_env *)0x0) {
        *env = *(spv_target_env *)((long)&spvTargetEnvNameMap[0].first + lVar2);
      }
      if (bVar3) {
        return bVar4;
      }
    }
    lVar2 = lVar2 + 0x10;
    bVar4 = lVar2 != 0x198;
    if (!bVar4) {
      if (env != (spv_target_env *)0x0) {
        *env = SPV_ENV_UNIVERSAL_1_0;
      }
      return bVar4;
    }
  } while( true );
}

Assistant:

bool spvParseTargetEnv(const char* s, spv_target_env* env) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  for (auto& name_env : spvTargetEnvNameMap) {
    if (match(name_env.first)) {
      if (env) {
        *env = name_env.second;
      }
      return true;
    }
  }
  if (env) *env = SPV_ENV_UNIVERSAL_1_0;
  return false;
}